

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_buffer.c
# Opt level: O0

int lj_cf_buffer_decode(lua_State *L)

{
  TValue *pTVar1;
  GCstr *str_00;
  GCstr *str;
  lua_State *L_local;
  
  str_00 = lj_lib_checkstrx(L,1);
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  pTVar1->u64 = 0xffffffffffffffff;
  lj_serialize_decode(L,L->top + -1,str_00);
  if (*(ulong *)((L->glref).ptr64 + 0x18) <= *(ulong *)((L->glref).ptr64 + 0x10)) {
    lj_gc_step(L);
  }
  return 1;
}

Assistant:

LJLIB_CF(buffer_decode)			LJLIB_REC(.)
{
  GCstr *str = lj_lib_checkstrx(L, 1);
  setnilV(L->top++);
  lj_serialize_decode(L, L->top-1, str);
  lj_gc_check(L);
  return 1;
}